

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDebugLine.cpp
# Opt level: O3

void __thiscall llvm::DWARFDebugLine::ParsingState::ParsingState(ParsingState *this,LineTable *LT)

{
  uint8_t uVar1;
  
  this->LineTable = LT;
  Row::Row(&this->Row,false);
  Sequence::Sequence(&this->Sequence);
  uVar1 = (this->LineTable->Prologue).DefaultIsStmt;
  (this->Row).Address.Address = 0;
  (this->Row).Address.SectionIndex = 0xffffffffffffffff;
  (this->Row).Line = 1;
  (this->Row).Column = 0;
  (this->Row).File = 1;
  (this->Row).Isa = '\0';
  (this->Row).Discriminator = 0;
  (this->Row).field_0x1d = (this->Row).field_0x1d & 0xe0 | uVar1 != '\0';
  (this->Sequence).LowPC = 0;
  (this->Sequence).HighPC = 0;
  (this->Sequence).SectionIndex = 0xffffffffffffffff;
  (this->Sequence).FirstRowIndex = 0;
  (this->Sequence).LastRowIndex = 0;
  (this->Sequence).Empty = true;
  return;
}

Assistant:

DWARFDebugLine::ParsingState::ParsingState(struct LineTable *LT)
    : LineTable(LT) {
  resetRowAndSequence();
}